

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_create_segmented_file
               (void *pData,uint32 data_size,void *pBase_data,uint base_data_size)

{
  uint16 uVar1;
  uint uVar2;
  uint32 val;
  uint uVar3;
  uint uVar4;
  crn_header *pcVar5;
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  void *in_RDI;
  crn_header *new_header;
  uint actual_base_data_size;
  crn_header *pHeader;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffd8;
  bool local_1;
  
  if ((in_RDI == (void *)0x0) || (in_ESI < 0x3e)) {
    local_1 = false;
  }
  else {
    pcVar5 = crnd_get_header((void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if (pcVar5 == (crn_header *)0x0) {
      local_1 = false;
    }
    else {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar5->m_flags);
      if ((uVar2 & 1) == 0) {
        val = crnd_get_segmented_file_size
                        ((void *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (uint32)((ulong)pcVar5 >> 0x20));
        if (in_ECX < val) {
          local_1 = false;
        }
        else {
          memcpy(in_RDX,in_RDI,(ulong)val);
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)in_RDX + 0x13));
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)in_RDX + 0x13),uVar2 | 1);
          crn_packed_uint<4U>::operator=((crn_packed_uint<4U> *)((long)in_RDX + 6),val);
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)in_RDX + 2));
          uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)in_RDX + 6));
          uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)in_RDX + 2));
          uVar1 = crc16((void *)((long)in_RDX + (ulong)uVar2),uVar3 - uVar4,0);
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)in_RDX + 10),(uint)uVar1);
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)in_RDX + 2));
          uVar1 = crc16((void *)((long)in_RDX + 6),uVar2 - 6,0);
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)in_RDX + 4),(uint)uVar1);
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool crnd_create_segmented_file(const void* pData, uint32 data_size, void* pBase_data, uint base_data_size) {
  if ((!pData) || (data_size < cCRNHeaderMinSize))
    return false;

  const crn_header* pHeader = crnd_get_header(pData, data_size);
  if (!pHeader)
    return false;

  if (pHeader->m_flags & cCRNHeaderFlagSegmented)
    return false;

  const uint actual_base_data_size = crnd_get_segmented_file_size(pData, data_size);
  if (base_data_size < actual_base_data_size)
    return false;

  memcpy(pBase_data, pData, actual_base_data_size);

  crn_header& new_header = *static_cast<crn_header*>(pBase_data);
  new_header.m_flags = new_header.m_flags | cCRNHeaderFlagSegmented;
  new_header.m_data_size = actual_base_data_size;

  new_header.m_data_crc16 = crc16((const uint8*)pBase_data + new_header.m_header_size, new_header.m_data_size - new_header.m_header_size);

  new_header.m_header_crc16 = crc16(&new_header.m_data_size, new_header.m_header_size - (uint32)((const uint8*)&new_header.m_data_size - (const uint8*)&new_header));

  CRND_ASSERT(crnd_validate_file(&new_header, actual_base_data_size, NULL));

  return true;
}